

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalGenerator::OutputLinkLibraries
          (cmLocalGenerator *this,cmComputeLinkInformation *pcli,
          cmLinkLineComputer *linkLineComputer,string *linkLibraries,string *frameworkPath,
          string *linkPath)

{
  cmMakefile *pcVar1;
  char *pcVar2;
  string local_220 [32];
  string local_200;
  string local_1e0;
  allocator local_1b9;
  undefined1 local_1b8 [8];
  string fwSearchFlag;
  undefined1 local_190 [8];
  string fwSearchFlagVar;
  char *stdLibs;
  string stdLibString;
  allocator local_121;
  undefined1 local_120 [8];
  string standardLibsVar;
  string local_f8;
  undefined1 local_d8 [8];
  string libPathTerminator;
  allocator local_a1;
  string local_a0;
  undefined1 local_80 [8];
  string libPathFlag;
  string linkLanguage;
  cmComputeLinkInformation *cli;
  string *linkPath_local;
  string *frameworkPath_local;
  string *linkLibraries_local;
  cmLinkLineComputer *linkLineComputer_local;
  cmComputeLinkInformation *pcli_local;
  cmLocalGenerator *this_local;
  
  cmComputeLinkInformation::GetLinkLanguage_abi_cxx11_
            ((string *)((long)&libPathFlag.field_2 + 8),pcli);
  pcVar1 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a0,"CMAKE_LIBRARY_PATH_FLAG",&local_a1);
  pcVar2 = cmMakefile::GetRequiredDefinition(pcVar1,&local_a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_80,pcVar2,(allocator *)(libPathTerminator.field_2._M_local_buf + 0xb));
  std::allocator<char>::~allocator
            ((allocator<char> *)(libPathTerminator.field_2._M_local_buf + 0xb));
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  pcVar1 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_f8,"CMAKE_LIBRARY_PATH_TERMINATOR",
             (allocator *)(standardLibsVar.field_2._M_local_buf + 0xf));
  pcVar2 = cmMakefile::GetSafeDefinition(pcVar1,&local_f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_d8,pcVar2,(allocator *)(standardLibsVar.field_2._M_local_buf + 0xe));
  std::allocator<char>::~allocator((allocator<char> *)(standardLibsVar.field_2._M_local_buf + 0xe));
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator((allocator<char> *)(standardLibsVar.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_120,"CMAKE_",&local_121);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  cmComputeLinkInformation::GetLinkLanguage_abi_cxx11_
            ((string *)((long)&stdLibString.field_2 + 8),pcli);
  std::__cxx11::string::operator+=
            ((string *)local_120,(string *)(stdLibString.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(stdLibString.field_2._M_local_buf + 8));
  std::__cxx11::string::operator+=((string *)local_120,"_STANDARD_LIBRARIES");
  std::__cxx11::string::string((string *)&stdLibs);
  fwSearchFlagVar.field_2._8_8_ = cmMakefile::GetDefinition(this->Makefile,(string *)local_120);
  if ((char *)fwSearchFlagVar.field_2._8_8_ != (char *)0x0) {
    std::__cxx11::string::operator=((string *)&stdLibs,(char *)fwSearchFlagVar.field_2._8_8_);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_190,"CMAKE_",(allocator *)(fwSearchFlag.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(fwSearchFlag.field_2._M_local_buf + 0xf));
  std::__cxx11::string::operator+=
            ((string *)local_190,(string *)(libPathFlag.field_2._M_local_buf + 8));
  std::__cxx11::string::operator+=((string *)local_190,"_FRAMEWORK_SEARCH_FLAG");
  pcVar2 = cmMakefile::GetSafeDefinition(this->Makefile,(string *)local_190);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_1b8,pcVar2,&local_1b9);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  cmLinkLineComputer::ComputeFrameworkPath(&local_1e0,linkLineComputer,pcli,(string *)local_1b8);
  std::__cxx11::string::operator=((string *)frameworkPath,(string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  cmLinkLineComputer::ComputeLinkPath
            (&local_200,linkLineComputer,pcli,(string *)local_80,(string *)local_d8);
  std::__cxx11::string::operator=((string *)linkPath,(string *)&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  (*linkLineComputer->_vptr_cmLinkLineComputer[3])(local_220,linkLineComputer,pcli,&stdLibs);
  std::__cxx11::string::operator=((string *)linkLibraries,local_220);
  std::__cxx11::string::~string(local_220);
  std::__cxx11::string::~string((string *)local_1b8);
  std::__cxx11::string::~string((string *)local_190);
  std::__cxx11::string::~string((string *)&stdLibs);
  std::__cxx11::string::~string((string *)local_120);
  std::__cxx11::string::~string((string *)local_d8);
  std::__cxx11::string::~string((string *)local_80);
  std::__cxx11::string::~string((string *)(libPathFlag.field_2._M_local_buf + 8));
  return;
}

Assistant:

void cmLocalGenerator::OutputLinkLibraries(
  cmComputeLinkInformation* pcli, cmLinkLineComputer* linkLineComputer,
  std::string& linkLibraries, std::string& frameworkPath,
  std::string& linkPath)
{
  cmComputeLinkInformation& cli = *pcli;

  std::string linkLanguage = cli.GetLinkLanguage();

  std::string libPathFlag =
    this->Makefile->GetRequiredDefinition("CMAKE_LIBRARY_PATH_FLAG");
  std::string libPathTerminator =
    this->Makefile->GetSafeDefinition("CMAKE_LIBRARY_PATH_TERMINATOR");

  // Add standard libraries for this language.
  std::string standardLibsVar = "CMAKE_";
  standardLibsVar += cli.GetLinkLanguage();
  standardLibsVar += "_STANDARD_LIBRARIES";
  std::string stdLibString;
  if (const char* stdLibs = this->Makefile->GetDefinition(standardLibsVar)) {
    stdLibString = stdLibs;
  }

  // Append the framework search path flags.
  std::string fwSearchFlagVar = "CMAKE_";
  fwSearchFlagVar += linkLanguage;
  fwSearchFlagVar += "_FRAMEWORK_SEARCH_FLAG";
  std::string fwSearchFlag =
    this->Makefile->GetSafeDefinition(fwSearchFlagVar);

  frameworkPath = linkLineComputer->ComputeFrameworkPath(cli, fwSearchFlag);
  linkPath =
    linkLineComputer->ComputeLinkPath(cli, libPathFlag, libPathTerminator);

  linkLibraries = linkLineComputer->ComputeLinkLibraries(cli, stdLibString);
}